

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

char * __thiscall NaVector::get_string(NaVector *this,char *szBuf,char *szDelim)

{
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  bool bVar4;
  double dVar5;
  NaReal fVal;
  uint i;
  char *szNext;
  char *szPtr;
  int local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_28 = in_RSI;
  local_20 = in_RDX;
  while( true ) {
    iVar1 = isspace((int)*local_28);
    bVar4 = false;
    if ((iVar1 != 0) && (bVar4 = false, *local_28 != '\0')) {
      pcVar2 = strchr(local_20,(int)*local_28);
      bVar4 = pcVar2 != (char *)0x0;
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  local_34 = 0;
  while( true ) {
    while( true ) {
      iVar1 = isspace((int)*local_28);
      bVar4 = false;
      if ((iVar1 != 0) && (bVar4 = false, *local_28 != '\0')) {
        pcVar2 = strchr(local_20,(int)*local_28);
        bVar4 = pcVar2 != (char *)0x0;
      }
      if (!bVar4) break;
      local_28 = local_28 + 1;
    }
    if ((*local_28 == '\0') || (pcVar2 = strchr(local_20,(int)*local_28), pcVar2 != (char *)0x0))
    break;
    dVar5 = strtod(local_28,&local_30);
    if (local_30 == local_28) {
      return local_28;
    }
    local_28 = local_30;
    (**(code **)(*in_RDI + 0x20))(in_RDI,local_34 + 1);
    pdVar3 = (double *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_34);
    *pdVar3 = dVar5;
    local_34 = local_34 + 1;
  }
  return local_28;
}

Assistant:

const char*
NaVector::get_string (const char* szBuf, const char* szDelim)
{
    const char  *szPtr = szBuf;
    char        *szNext;
    unsigned    i;

    // skip leading spaces
    while(isspace(*szPtr) && *szPtr != '\0' &&
          NULL != strchr(szDelim, *szPtr))
        ++szPtr;

    new_dim(0);

    for(i = 0; ; ++i){
        //??? Strange things: szPtr value differs from (4) to (1) 
        //???NaPrintLog("get_string(1): szPtr='%s'(%p)\n", szPtr, szPtr);

        // skip leading spaces
        while(isspace(*szPtr) && *szPtr != '\0' &&
              NULL != strchr(szDelim, *szPtr))
            ++szPtr;

        //???NaPrintLog("get_string(2): szPtr='%s'(%p)\n", szPtr, szPtr);

        // while current string is not a delimiter and is not EOS...
        if('\0' == *szPtr || NULL != strchr(szDelim, *szPtr))
            break;

        // read number
        NaReal  fVal = strtod(szPtr, &szNext);
        //???NaPrintLog("get_string(): '%s' -> %g, next is '%s'\n",
        //???           szPtr, fVal, szNext);

        if(szNext == szPtr){
            // error while reading
            return szPtr;
        }
        szPtr = szNext;
        //???NaPrintLog("get_string(3): szPtr='%s'(%p)\n", szPtr, szPtr);

        new_dim(i + 1);
        fetch(i) = fVal;

        //???NaPrintLog("get_string(4): szPtr='%s'(%p)\n", szPtr, szPtr);
    }

    return szPtr;
}